

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O0

void __thiscall
HighsCliqueTable::extractCliques
          (HighsCliqueTable *this,HighsMipSolver *mipsolver,vector<int,_std::allocator<int>_> *inds,
          vector<double,_std::allocator<double>_> *vals,
          vector<signed_char,_std::allocator<signed_char>_> *complementation,double rhs,
          HighsInt nbin,vector<int,_std::allocator<int>_> *perm,
          vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *clique,
          double feastol)

{
  anon_class_16_2_0183c0cc __pred;
  anon_class_16_2_cb98ba35 __pred_00;
  bool bVar1;
  HighsVarType HVar2;
  int iVar3;
  pointer pHVar4;
  HighsDomain *this_00;
  iterator this_01;
  iterator cliquevars;
  iterator iVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var6;
  difference_type dVar7;
  size_type sVar8;
  reference pvVar9;
  reference pvVar10;
  pointer pHVar11;
  reference pvVar12;
  reference piVar13;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<int,_std::allocator<int>_> *in_RDX;
  HighsCDouble *in_RSI;
  vector<double,_std::allocator<double>_> *pvVar14;
  vector<int,_std::allocator<int>_> *in_R8;
  double in_XMM0_Qa;
  double dVar15;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  vector<int,_std::allocator<int>_> *in_stack_00000008;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
  *in_stack_00000010;
  HighsInt pos_1;
  iterator j_2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> cliqueend;
  double mincliqueval;
  HighsInt k;
  HighsInt pos;
  int j_1;
  HighsCDouble constant;
  HighsCDouble coef;
  HighsCDouble implcolub;
  HighsCDouble colub;
  HighsInt col;
  HighsInt j;
  HighsCDouble impliedub;
  HighsInt bincol;
  HighsInt i;
  HighsInt ntotal;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> binaryend;
  HighsDomain *globaldom;
  HighsImplications *implics;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffce8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffcf0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffcf8;
  anon_class_8_1_8992ca70 in_stack_fffffffffffffd00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd08;
  vector<int,_std::allocator<int>_> *this_02;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd10;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd18;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd28;
  double in_stack_fffffffffffffd58;
  double in_stack_fffffffffffffd60;
  undefined8 in_stack_fffffffffffffd68;
  HighsImplications *in_stack_fffffffffffffd70;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1d0;
  int *local_1c8;
  double *local_1b8;
  int *local_1b0;
  int *local_1a8;
  int *local_1a0;
  int *local_198;
  double local_190;
  int local_184;
  undefined4 local_180;
  undefined4 local_17c;
  int local_178;
  int local_174;
  HighsMipSolver *local_168;
  int *local_160;
  HighsCDouble local_158;
  HighsCDouble local_148;
  HighsCDouble local_138;
  HighsCDouble local_128;
  HighsCDouble local_118;
  HighsCDouble local_108;
  HighsCDouble local_f8;
  HighsCDouble local_e8;
  HighsCDouble local_d8;
  int local_c8;
  int local_c4;
  HighsCDouble local_c0;
  HighsCDouble local_b0;
  value_type local_9c;
  int local_98;
  int local_94;
  int *local_90;
  HighsDomain *local_88;
  vector<int,_std::allocator<int>_> *pvVar16;
  HighsInt origin;
  HighsMipSolver *mipsolver_00;
  
  std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
            ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x5350fd);
  pHVar4 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x53511f);
  this_00 = &pHVar4->domain;
  std::vector<int,_std::allocator<int>_>::size(in_RDX);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd10._M_current,
             (size_type)in_stack_fffffffffffffd08._M_current);
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffce8._M_current);
  this_01 = std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffce8._M_current);
  std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0);
  cliquevars = std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffce8._M_current);
  iVar5 = std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffce8._M_current);
  __pred.inds = in_stack_fffffffffffffd18;
  __pred.globaldom = (HighsDomain *)in_stack_fffffffffffffd10._M_current;
  local_88 = this_00;
  pvVar16 = in_RDX;
  _Var6 = std::
          partition<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractCliques(HighsMipSolver_const&,std::vector<int,std::allocator<int>>&,std::vector<double,std::allocator<double>>&,std::vector<signed_char,std::allocator<signed_char>>&,double,int,std::vector<int,std::allocator<int>>&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,double)::__0>
                    (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,__pred);
  local_90 = (int *)std::vector<int,_std::allocator<int>_>::begin
                              (in_stack_fffffffffffffce8._M_current);
  dVar7 = __gnu_cxx::operator-
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_fffffffffffffcf0._M_current,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_fffffffffffffce8._M_current);
  iVar3 = (int)dVar7;
  sVar8 = std::vector<int,_std::allocator<int>_>::size(in_stack_00000008);
  local_94 = (int)sVar8;
  local_168 = (HighsMipSolver *)_Var6._M_current;
  if (iVar3 < local_94) {
    for (local_98 = 0; local_168 = (HighsMipSolver *)_Var6._M_current, local_98 != iVar3;
        local_98 = local_98 + 1) {
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000008,(long)local_98);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)*pvVar9);
      local_9c = *pvVar9;
      HighsCDouble::HighsCDouble(&local_c0,in_XMM0_Qa);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000008,(long)local_98);
      std::vector<double,_std::allocator<double>_>::operator[](in_RCX,(long)*pvVar9);
      local_b0 = HighsCDouble::operator-
                           ((HighsCDouble *)in_stack_fffffffffffffcf0._M_current,
                            (double)in_stack_fffffffffffffce8._M_current);
      for (local_c4 = iVar3; local_c4 != local_94; local_c4 = local_c4 + 1) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           (in_stack_00000008,(long)local_c4);
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)*pvVar9);
        local_c8 = *pvVar9;
        bVar1 = HighsDomain::isFixed
                          ((HighsDomain *)in_stack_fffffffffffffd00.vals,
                           (HighsInt)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
        if (!bVar1) {
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              (&(pHVar4->domain).col_upper_,(long)local_c8);
          HighsCDouble::HighsCDouble(&local_e8,*pvVar10);
          std::vector<double,_std::allocator<double>_>::operator[]
                    (&(pHVar4->domain).col_lower_,(long)local_c8);
          local_d8 = HighsCDouble::operator-
                               ((HighsCDouble *)in_stack_fffffffffffffcf0._M_current,
                                (double)in_stack_fffffffffffffce8._M_current);
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             (in_stack_00000008,(long)local_c4);
          std::vector<double,_std::allocator<double>_>::operator[](in_RCX,(long)*pvVar9);
          local_f8 = HighsCDouble::operator/
                               ((HighsCDouble *)in_stack_fffffffffffffce8._M_current,
                                2.6981394281754e-317);
          HVar2 = HighsMipSolver::variableType
                            ((HighsMipSolver *)in_stack_fffffffffffffcf0._M_current,
                             (HighsInt)((ulong)in_stack_fffffffffffffce8._M_current >> 0x20));
          if (HVar2 != kContinuous) {
            dVar15 = HighsCDouble::operator_cast_to_double(&local_f8);
            pHVar11 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                      ::operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                    *)0x5354bb);
            dVar15 = floor(dVar15 + pHVar11->feastol);
            HighsCDouble::HighsCDouble(&local_108,dVar15);
            local_f8.lo = local_108.lo;
            local_f8.hi = local_108.hi;
          }
          local_118 = HighsCDouble::operator-
                                ((HighsCDouble *)in_stack_fffffffffffffcf0._M_current,
                                 (double)in_stack_fffffffffffffce8._M_current);
          bVar1 = HighsCDouble::operator<
                            ((HighsCDouble *)in_stack_fffffffffffffcf0._M_current,
                             (HighsCDouble *)in_stack_fffffffffffffce8._M_current);
          if (bVar1) {
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                               (in_stack_00000008,(long)local_98);
            pvVar12 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                                ((vector<signed_char,_std::allocator<signed_char>_> *)in_R8,
                                 (long)*pvVar9);
            if (*pvVar12 == -1) {
              local_148 = HighsCDouble::operator-
                                    ((HighsCDouble *)in_stack_fffffffffffffcf0._M_current,
                                     (HighsCDouble *)in_stack_fffffffffffffce8._M_current);
              local_128.hi = local_148.hi;
              local_128.lo = local_148.lo;
              local_138.hi = local_f8.hi;
              local_138.lo = local_f8.lo;
            }
            else {
              local_158 = HighsCDouble::operator-
                                    ((HighsCDouble *)in_stack_fffffffffffffcf0._M_current,
                                     (HighsCDouble *)in_stack_fffffffffffffce8._M_current);
              local_128.hi = local_158.hi;
              local_128.lo = local_158.lo;
              local_138.hi = local_d8.hi;
              local_138.lo = local_d8.lo;
            }
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                               (in_stack_00000008,(long)local_c4);
            pvVar12 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                                ((vector<signed_char,_std::allocator<signed_char>_> *)in_R8,
                                 (long)*pvVar9);
            if (*pvVar12 == -1) {
              std::vector<double,_std::allocator<double>_>::operator[]
                        (&(pHVar4->domain).col_upper_,(long)local_c8);
              HighsCDouble::operator-=
                        ((HighsCDouble *)in_stack_fffffffffffffcf0._M_current,
                         (double)in_stack_fffffffffffffce8._M_current);
              HighsCDouble::operator_cast_to_double(&local_128);
              HighsCDouble::operator_cast_to_double(&local_138);
              HighsImplications::addVLB
                        (in_stack_fffffffffffffd70,
                         (HighsInt)((ulong)in_stack_fffffffffffffd68 >> 0x20),
                         (HighsInt)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                         in_stack_fffffffffffffd58);
            }
            else {
              std::vector<double,_std::allocator<double>_>::operator[]
                        (&(pHVar4->domain).col_lower_,(long)local_c8);
              HighsCDouble::operator+=
                        ((HighsCDouble *)in_stack_fffffffffffffd00.vals,
                         (double)in_stack_fffffffffffffcf8);
              HighsCDouble::operator_cast_to_double(&local_128);
              HighsCDouble::operator_cast_to_double(&local_138);
              HighsImplications::addVUB
                        (in_stack_fffffffffffffd70,
                         (HighsInt)((ulong)in_stack_fffffffffffffd68 >> 0x20),
                         (HighsInt)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                         in_stack_fffffffffffffd58);
            }
          }
        }
      }
    }
  }
  if (1 < iVar3) {
    local_160 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 (in_stack_fffffffffffffce8._M_current);
    mipsolver_00 = local_168;
    pdqsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractCliques(HighsMipSolver_const&,std::vector<int,std::allocator<int>>&,std::vector<double,std::allocator<double>>&,std::vector<signed_char,std::allocator<signed_char>>&,double,int,std::vector<int,std::allocator<int>>&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,double)::__1>
              (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000008,0);
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](in_RCX,(long)*pvVar9);
    dVar15 = *pvVar10;
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000008,1);
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](in_RCX,(long)*pvVar9);
    if (in_XMM0_Qa + in_XMM1_Qa < dVar15 + *pvVar10) {
      std::vector<double,_std::allocator<double>_>::operator[](in_RCX,0);
      pvVar14 = in_RCX;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         (in_stack_00000008,(long)(iVar3 + -1));
      std::vector<double,_std::allocator<double>_>::operator[](pvVar14,(long)*pvVar9);
      std::abs((int)pvVar14);
      local_184 = iVar3;
      if (extraout_XMM0_Qa <= in_XMM1_Qa) {
        pvVar14 = in_RCX;
        dVar15 = in_XMM0_Qa;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           (in_stack_00000008,(long)(iVar3 + -1));
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](pvVar14,(long)*pvVar9);
        if (dVar15 < *pvVar10 + *pvVar10 + -in_XMM1_Qa) {
          std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          clear((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *
                )0x535a46);
          for (local_174 = 0; origin = (HighsInt)((ulong)pvVar16 >> 0x20), local_174 != iVar3;
              local_174 = local_174 + 1) {
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                               (in_stack_00000008,(long)local_174);
            local_178 = *pvVar9;
            pvVar12 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                                ((vector<signed_char,_std::allocator<signed_char>_> *)in_R8,
                                 (long)local_178);
            if (*pvVar12 == -1) {
              std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)local_178);
              local_17c = 0;
              std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
              emplace_back<int&,int>
                        ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          *)in_stack_fffffffffffffd00.vals,(int *)in_stack_fffffffffffffcf8,
                         in_stack_fffffffffffffcf0._M_current);
            }
            else {
              std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)local_178);
              local_180 = 1;
              std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
              emplace_back<int&,int>
                        ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          *)in_stack_fffffffffffffd00.vals,(int *)in_stack_fffffffffffffcf8,
                         in_stack_fffffffffffffcf0._M_current);
            }
          }
          std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          data((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
               0x535b58);
          addClique((HighsCliqueTable *)this_01._M_current,mipsolver_00,
                    (CliqueVar *)cliquevars._M_current,(HighsInt)((ulong)iVar5._M_current >> 0x20),
                    SUB81((ulong)iVar5._M_current >> 0x18,0),origin);
          HighsDomain::infeasible(this_00);
          return;
        }
      }
      do {
        do {
          local_184 = local_184 + -1;
          if (local_184 == 0) {
            return;
          }
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             (in_stack_00000008,(long)local_184);
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](in_RCX,(long)*pvVar9);
          local_190 = (in_XMM0_Qa - *pvVar10) + in_XMM1_Qa;
          local_1a0 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                       (in_stack_fffffffffffffce8._M_current);
          local_1b0 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                       (in_stack_fffffffffffffce8._M_current);
          local_1a8 = (int *)__gnu_cxx::
                             __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                             operator+((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                        *)in_stack_fffffffffffffcf8,
                                       in_stack_fffffffffffffcf0._M_current);
          local_1b8 = &local_190;
          __pred_00.mincliqueval = (double *)in_stack_fffffffffffffd18;
          __pred_00.vals =
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd10._M_current;
          local_198 = (int *)std::
                             partition_point<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractCliques(HighsMipSolver_const&,std::vector<int,std::allocator<int>>&,std::vector<double,std::allocator<double>>&,std::vector<signed_char,std::allocator<signed_char>>&,double,int,std::vector<int,std::allocator<int>>&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,double)::__2>
                                       (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
                                        __pred_00);
          local_1c8 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                       (in_stack_fffffffffffffce8._M_current);
          bVar1 = __gnu_cxx::operator==
                            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             in_stack_fffffffffffffcf0._M_current,
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             in_stack_fffffffffffffce8._M_current);
        } while (bVar1);
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        clear((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
              0x535ce9);
        local_1d0._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              (in_stack_fffffffffffffce8._M_current);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_fffffffffffffcf0._M_current,
                                  (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_fffffffffffffce8._M_current), bVar1) {
          piVar13 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator*(&local_1d0);
          iVar3 = *piVar13;
          pvVar12 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                              ((vector<signed_char,_std::allocator<signed_char>_> *)in_R8,
                               (long)iVar3);
          if (*pvVar12 == -1) {
            in_stack_fffffffffffffd28._M_current = (int *)in_stack_00000010;
            std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)iVar3);
            std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
            emplace_back<int&,int>
                      ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        *)in_stack_fffffffffffffd00.vals,(int *)in_stack_fffffffffffffcf8,
                       in_stack_fffffffffffffcf0._M_current);
          }
          else {
            in_stack_fffffffffffffd20._M_current = (int *)in_stack_00000010;
            std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)iVar3);
            std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
            emplace_back<int&,int>
                      ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        *)in_stack_fffffffffffffd00.vals,(int *)in_stack_fffffffffffffcf8,
                       in_stack_fffffffffffffcf0._M_current);
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_1d0);
        }
        in_stack_fffffffffffffd18 = in_R8;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           (in_stack_00000008,(long)local_184);
        pvVar12 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                            ((vector<signed_char,_std::allocator<signed_char>_> *)
                             in_stack_fffffffffffffd18,(long)*pvVar9);
        if (*pvVar12 == -1) {
          this_02 = in_RDX;
          in_stack_fffffffffffffd10._M_current = (int *)in_stack_00000010;
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             (in_stack_00000008,(long)local_184);
          std::vector<int,_std::allocator<int>_>::operator[](this_02,(long)*pvVar9);
          std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
          emplace_back<int&,int>
                    ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      *)in_stack_fffffffffffffd00.vals,(int *)in_stack_fffffffffffffcf8,
                     in_stack_fffffffffffffcf0._M_current);
        }
        else {
          in_stack_fffffffffffffcf8 = in_RDX;
          in_stack_fffffffffffffd00.vals =
               (vector<double,_std::allocator<double>_> *)in_stack_00000010;
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             (in_stack_00000008,(long)local_184);
          std::vector<int,_std::allocator<int>_>::operator[]
                    (in_stack_fffffffffffffcf8,(long)*pvVar9);
          std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
          emplace_back<int&,int>
                    ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      *)in_stack_fffffffffffffd00.vals,(int *)in_stack_fffffffffffffcf8,
                     in_stack_fffffffffffffcf0._M_current);
        }
        sVar8 = std::
                vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
                size(in_stack_00000010);
        if (1 < sVar8) {
          in_stack_fffffffffffffce8._M_current = (int *)in_RSI;
          in_stack_fffffffffffffcf0._M_current =
               (int *)std::
                      vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ::data((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                              *)0x535f06);
          std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          size(in_stack_00000010);
          addClique((HighsCliqueTable *)this_01._M_current,mipsolver_00,
                    (CliqueVar *)cliquevars._M_current,(HighsInt)((ulong)iVar5._M_current >> 0x20),
                    SUB81((ulong)iVar5._M_current >> 0x18,0),(HighsInt)((ulong)pvVar16 >> 0x20));
          bVar1 = HighsDomain::infeasible(this_00);
          if (bVar1) {
            return;
          }
        }
        std::vector<int,_std::allocator<int>_>::begin
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffce8._M_current);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                   in_stack_fffffffffffffcf8,(difference_type)in_stack_fffffffffffffcf0._M_current);
        bVar1 = __gnu_cxx::operator==
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           in_stack_fffffffffffffcf0._M_current,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           in_stack_fffffffffffffce8._M_current);
      } while (!bVar1);
    }
  }
  return;
}

Assistant:

void HighsCliqueTable::extractCliques(
    const HighsMipSolver& mipsolver, std::vector<HighsInt>& inds,
    std::vector<double>& vals, std::vector<int8_t>& complementation, double rhs,
    HighsInt nbin, std::vector<HighsInt>& perm, std::vector<CliqueVar>& clique,
    double feastol) {
  HighsImplications& implics = mipsolver.mipdata_->implications;
  HighsDomain& globaldom = mipsolver.mipdata_->domain;

  perm.resize(inds.size());
  std::iota(perm.begin(), perm.end(), 0);

  auto binaryend = std::partition(perm.begin(), perm.end(), [&](HighsInt pos) {
    return globaldom.isBinary(inds[pos]);
  });
  nbin = binaryend - perm.begin();
  HighsInt ntotal = (HighsInt)perm.size();

  // if not all variables are binary, we extract variable upper and lower bounds
  // constraints on the non-binary variable for each binary variable in the
  // constraint
  if (nbin < ntotal) {
    for (HighsInt i = 0; i != nbin; ++i) {
      HighsInt bincol = inds[perm[i]];
      HighsCDouble impliedub = HighsCDouble(rhs) - vals[perm[i]];
      for (HighsInt j = nbin; j != ntotal; ++j) {
        HighsInt col = inds[perm[j]];
        if (globaldom.isFixed(col)) continue;

        HighsCDouble colub =
            HighsCDouble(globaldom.col_upper_[col]) - globaldom.col_lower_[col];
        HighsCDouble implcolub = impliedub / vals[perm[j]];
        if (mipsolver.variableType(col) != HighsVarType::kContinuous)
          implcolub =
              std::floor(double(implcolub) + mipsolver.mipdata_->feastol);

        if (implcolub < colub - feastol) {
          HighsCDouble coef;
          HighsCDouble constant;

          if (complementation[perm[i]] == -1) {
            coef = colub - implcolub;
            constant = implcolub;
          } else {
            coef = implcolub - colub;
            constant = colub;
          }

          if (complementation[perm[j]] == -1) {
            constant -= globaldom.col_upper_[col];
            implics.addVLB(col, bincol, -double(coef), -double(constant));
          } else {
            constant += globaldom.col_lower_[col];
            implics.addVUB(col, bincol, double(coef), double(constant));
          }
        }
      }
    }
  }

  // only one binary means we do have no cliques
  if (nbin <= 1) return;

  pdqsort(perm.begin(), binaryend, [&](HighsInt p1, HighsInt p2) {
    return std::make_pair(vals[p1], p1) > std::make_pair(vals[p2], p2);
  });
  // check if any cliques exists
  if (vals[perm[0]] + vals[perm[1]] <= rhs + feastol) return;

  // check if this is a set packing constraint (or easily transformable
  // into one)
  if (std::abs(vals[0] - vals[perm[nbin - 1]]) <= feastol &&
      rhs < 2 * vals[perm[nbin - 1]] - feastol) {
    // the coefficients on the binary variables are all equal and the
    // right hand side is strictly below two times the coefficient value.
    // Therefore the constraint can be transformed into a set packing
    // constraint by relaxing out all non-binary variables (if any),
    // dividing by the coefficient value of the binary variables, and then
    // possibly rounding down the right hand side
    clique.clear();

    for (auto j = 0; j != nbin; ++j) {
      HighsInt pos = perm[j];
      if (complementation[pos] == -1)
        clique.emplace_back(inds[pos], 0);
      else
        clique.emplace_back(inds[pos], 1);
    }

    addClique(mipsolver, clique.data(), nbin);
    if (globaldom.infeasible()) return;
    // printf("extracted this clique:\n");
    // printClique(clique);
    return;
  }

  for (HighsInt k = nbin - 1; k != 0; --k) {
    double mincliqueval = rhs - vals[perm[k]] + feastol;
    auto cliqueend = std::partition_point(
        perm.begin(), perm.begin() + k,
        [&](HighsInt p) { return vals[p] > mincliqueval; });

    // no clique for this variable
    if (cliqueend == perm.begin()) continue;

    clique.clear();

    for (auto j = perm.begin(); j != cliqueend; ++j) {
      HighsInt pos = *j;
      if (complementation[pos] == -1)
        clique.emplace_back(inds[pos], 0);
      else
        clique.emplace_back(inds[pos], 1);
    }

    if (complementation[perm[k]] == -1)
      clique.emplace_back(inds[perm[k]], 0);
    else
      clique.emplace_back(inds[perm[k]], 1);

    // printf("extracted this clique:\n");
    // printClique(clique);

    if (clique.size() >= 2) {
      // if (clique.size() > 2) runCliqueSubsumption(globaldom, clique);
      // runCliqueMerging(globaldom, clique);
      // if (clique.size() >= 2) {
      addClique(mipsolver, clique.data(), clique.size());
      if (globaldom.infeasible()) return;
      //}
    }

    // further cliques are just subsets of this clique
    if (cliqueend == perm.begin() + k) return;
  }
}